

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csmPointCloud.cpp
# Opt level: O2

void __thiscall
csm::ModelBounds::ModelBounds
          (ModelBounds *this,ModelCoord *center,double dim0,double dim1,double dim2)

{
  double dVar1;
  Error *this_00;
  allocator<char> local_5e;
  allocator<char> local_5d;
  ErrorType local_5c;
  string local_58;
  string local_38;
  
  (this->theCenter).m2 = center->m2;
  dVar1 = center->m1;
  (this->theCenter).m0 = center->m0;
  (this->theCenter).m1 = dVar1;
  (this->theA0).m0 = 1.0;
  (this->theA0).m1 = 0.0;
  (this->theA0).m2 = 0.0;
  (this->theA1).m0 = 0.0;
  (this->theA1).m1 = 1.0;
  (this->theA2).m1 = 0.0;
  (this->theA1).m2 = 0.0;
  (this->theA2).m0 = 0.0;
  (this->theA2).m2 = 1.0;
  this->theDim0 = ABS(dim0);
  this->theDim1 = ABS(dim1);
  this->theDim2 = ABS(dim2);
  if (((dim0 != 0.0) || (NAN(dim0))) && ((dim1 != 0.0 || (NAN(dim1))))) {
    if ((dim2 != 0.0) || (NAN(dim2))) {
      return;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x50);
  local_5c = ILLEGAL_MATH_OPERATION;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ModelBounds dimension is not a positive value",&local_5d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"ModelBounds constructor",&local_5e);
  Error::Error(this_00,&local_5c,&local_38,&local_58);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ModelBounds::ModelBounds(const ModelCoord& center,
                         double dim0,
                         double dim1,
                         double dim2)
   :
      theCenter (center),
      theA0     (1.0, 0.0, 0.0),
      theA1     (0.0, 1.0, 0.0),
      theA2     (0.0, 0.0, 1.0),
      theDim0   (std::abs(dim0)),
      theDim1   (std::abs(dim1)),
      theDim2   (std::abs(dim2))
{
   // check for errors in dimensions
   if ((theDim0 <= 0.0) || (theDim1 <= 0.0) || (theDim2 <= 0.0))
   {
      throw csm::Error(csm::Error::ILLEGAL_MATH_OPERATION,
                       "ModelBounds dimension is not a positive value",
                       "ModelBounds constructor");
   }
}